

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O2

QTlsBackend * QTlsBackend::findBackend(QString *backendName)

{
  Type *pTVar1;
  QTlsBackend *pQVar2;
  QLoggingCategory *pQVar3;
  QDebug *this;
  long in_FS_OFFSET;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>::operator()
                     ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>
                       *)backendName);
  if (pTVar1 != (Type *)0x0) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>::instance
                       ();
    pQVar2 = anon_unknown.dwarf_547509::BackendCollection::backend(pTVar1,backendName);
    if (pQVar2 != (QTlsBackend *)0x0) goto LAB_001c2fac;
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      QMessageLogger::warning();
      this = QDebug::operator<<(&local_20,"Cannot create unknown backend named");
      QDebug::operator<<(this,backendName);
      QDebug::~QDebug(&local_20);
    }
  }
  pQVar2 = (QTlsBackend *)0x0;
LAB_001c2fac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QTlsBackend *QTlsBackend::findBackend(const QString &backendName)
{
    if (!backends())
        return {};

    if (auto *fct = backends->backend(backendName))
        return fct;

    qCWarning(lcSsl) << "Cannot create unknown backend named" << backendName;
    return nullptr;
}